

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O3

void tst_signal_basic(void)

{
  _Invoker_type *__dest;
  _Invoker_type *__dest_00;
  Signal<> SVar1;
  _func_int **pp_Var2;
  int iVar3;
  ostream *poVar4;
  socklen_t sVar5;
  _Invoker_type p_Var6;
  offset_in__Undefined_class_to_subr oVar7;
  float *pfVar8;
  bool bVar9;
  undefined **local_288;
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatCFunc;
  SignalHandler_Function<int> intLambda;
  SignalHandler_Function<int> intCFunc;
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatLambda;
  function<void_()> local_1c8;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  function<void_(int)> local_188;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  SignalHandler_Function<> voidLambda;
  SignalHandler_Function<> voidCFunc;
  Signal<int> local_b0;
  Signal<int> signal_int;
  string emitted_string;
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  signal_string_float_float;
  Signal<> signal_void;
  pointer local_70;
  undefined1 local_68 [20];
  int local_54;
  undefined1 auStack_50 [4];
  int emitted_int;
  SignalEmitter emitter;
  float local_38;
  float emitted_float1;
  float emitted_float2;
  bool called_void;
  bool called_int;
  bool called_string_float_float;
  
  p_Var6 = (_Invoker_type)((long)&emitted_float1 + 1);
  emitted_float1._1_1_ = '\0';
  emitted_float1._2_1_ = '\0';
  emitted_float1._3_1_ = '\0';
  _auStack_50 = &PTR__SignalEmitter_001159d8;
  emitter._vptr_SignalEmitter = (_func_int **)0x0;
  local_128 = (undefined1  [8])&PTR__SignalHandler_Function_00115b38;
  stringFloatFloatLambda.m_handler._M_invoker = p_Var6;
  std::function<void_()>::function
            ((function<void_()> *)&voidLambda,
             (function<void_()> *)&stringFloatFloatLambda.m_handler._M_invoker);
  sVar5 = (socklen_t)p_Var6;
  __dest = &stringFloatFloatLambda.m_handler._M_invoker;
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:37:41)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  local_1c8.super__Function_base._M_functor._8_8_ = 0;
  local_1c8.super__Function_base._M_functor._M_unused._M_object = cfunc_void;
  local_1c8._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1c8.super__Function_base._M_manager =
       std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  voidLambda.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115b38;
  std::function<void_()>::function((function<void_()> *)&voidCFunc,&local_1c8);
  if (local_1c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1c8.super__Function_base._M_manager)
              ((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  signal_string_float_float.super_SignalBase._vptr_SignalBase =
       (SignalBase)&PTR__SignalBase_00115980;
  rengine::Signal<>::connect
            ((Signal<> *)&signal_string_float_float,(int)auStack_50,(sockaddr *)local_128,sVar5);
  rengine::Signal<>::connect
            ((Signal<> *)&signal_string_float_float,(int)auStack_50,
             (sockaddr *)&voidLambda.m_handler._M_invoker,sVar5);
  rengine::Signal<>::emit((Signal<> *)&signal_string_float_float,(SignalEmitter *)auStack_50);
  if (cfunc_void_called == false) {
    __assert_fail("cfunc_void_called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x2c,"void tst_signal_basic()");
  }
  if (emitted_float1._1_1_ == '\0') {
    __assert_fail("called_void",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x2d,"void tst_signal_basic()");
  }
  rengine::Signal<>::disconnect
            ((Signal<> *)&signal_string_float_float,(SignalEmitter *)auStack_50,
             (SignalHandler<> *)&voidLambda.m_handler._M_invoker);
  rengine::Signal<>::disconnect
            ((Signal<> *)&signal_string_float_float,(SignalEmitter *)auStack_50,
             (SignalHandler<> *)local_128);
  local_1a8._8_8_ = &local_54;
  local_54 = 0;
  oVar7 = (long)&emitted_float1 + 2;
  local_190 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:50:43)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:50:43)>
              ::_M_manager;
  stringFloatFloatCFunc.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115ae8;
  local_1a8._M_unused._M_member_pointer = oVar7;
  std::function<void_(int)>::function
            ((function<void_(int)> *)&intLambda,(function<void_(int)> *)&local_1a8);
  sVar5 = (socklen_t)oVar7;
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  local_188.super__Function_base._M_functor._8_8_ = 0;
  local_188.super__Function_base._M_functor._M_unused._M_object = cfunc_int;
  local_188._M_invoker = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_188.super__Function_base._M_manager =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  intLambda.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115ae8;
  std::function<void_(int)>::function((function<void_(int)> *)&intCFunc,&local_188);
  if (local_188.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_188.super__Function_base._M_manager)
              ((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  local_b0.super_SignalBase._vptr_SignalBase = (SignalBase)&PTR__SignalBase_00115a08;
  rengine::Signal<int>::connect
            (&local_b0,(int)auStack_50,(sockaddr *)&stringFloatFloatCFunc.m_handler._M_invoker,sVar5
            );
  rengine::Signal<int>::connect
            (&local_b0,(int)auStack_50,(sockaddr *)&intLambda.m_handler._M_invoker,sVar5);
  rengine::Signal<int>::emit(&local_b0,(SignalEmitter *)auStack_50,0x2a);
  if (emitted_float1._2_1_ != '\0') {
    if (cfunc_int_called == false) {
      __assert_fail("cfunc_int_called",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x3c,"void tst_signal_basic()");
    }
    if (local_54 != 0x2a) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_54 != 0x2a) {
        __assert_fail("(emitted_int) == (42)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                      ,0x3d,"void tst_signal_basic()");
      }
    }
    if (cfuncvalue_int != 0x2a) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,cfuncvalue_int);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (cfuncvalue_int != 0x2a) {
        __assert_fail("(cfuncvalue_int) == (42)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                      ,0x3e,"void tst_signal_basic()");
      }
    }
    signal_int.super_SignalBase._vptr_SignalBase = (SignalBase)&emitted_string._M_string_length;
    emitted_string._M_dataplus._M_p = (pointer)0x0;
    emitted_string._M_string_length._0_1_ = 0;
    emitter.m_buckets._4_4_ = 0.0;
    local_38 = 0.0;
    voidCFunc.m_handler._M_invoker = (_Invoker_type)0x0;
    voidCFunc.m_handler._M_invoker = (_Invoker_type)operator_new(0x20);
    *(long *)voidCFunc.m_handler._M_invoker = (long)&emitted_float1 + 3;
    *(Signal<int> **)(voidCFunc.m_handler._M_invoker + 8) = &signal_int;
    *(undefined1 **)(voidCFunc.m_handler._M_invoker + 0x10) =
         (undefined1 *)((long)&emitter.m_buckets + 4);
    pfVar8 = &local_38;
    *(float **)(voidCFunc.m_handler._M_invoker + 0x18) = pfVar8;
    intCFunc.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115a98;
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
    ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                *)&stringFloatFloatLambda,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                *)&voidCFunc.m_handler._M_invoker);
    sVar5 = (socklen_t)pfVar8;
    __dest_00 = &voidCFunc.m_handler._M_invoker;
    std::
    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:67:78)>
    ::_M_manager((_Any_data *)__dest_00,(_Any_data *)__dest_00,__destroy_functor);
    local_168.super__Function_base._M_functor._8_8_ = 0;
    local_168.super__Function_base._M_functor._M_unused._M_object = cfunc_string_float_float;
    local_168._M_invoker =
         std::
         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
         ::_M_invoke;
    local_168.super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
         ::_M_manager;
    local_288 = &PTR__SignalHandler_Function_00115a98;
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
    ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                *)&stringFloatFloatCFunc,&local_168);
    if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_168.super__Function_base._M_manager)
                ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
    }
    emitted_string.field_2._8_8_ = &PTR__SignalBase_00115a50;
    rengine::
    Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
    ::connect((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
               *)((long)&emitted_string.field_2 + 8),(int)auStack_50,
              (sockaddr *)&intCFunc.m_handler._M_invoker,sVar5);
    rengine::
    Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
    ::connect((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
               *)((long)&emitted_string.field_2 + 8),(int)auStack_50,(sockaddr *)&local_288,sVar5);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"one","");
    rengine::
    Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
    ::emit((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
            *)((long)&emitted_string.field_2 + 8),(SignalEmitter *)auStack_50,&local_148,2.0,3.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if (emitted_float1._3_1_ != '\0') {
      if (cfunc_string_float_float_called == false) {
        __assert_fail("cfunc_string_float_float_called",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                      ,0x4f,"void tst_signal_basic()");
      }
      signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
      SVar1.super_SignalBase._vptr_SignalBase = signal_void.super_SignalBase._vptr_SignalBase;
      if (emitted_string._M_dataplus._M_p == local_70) {
        if (emitted_string._M_dataplus._M_p == (pointer)0x0) {
          bVar9 = true;
        }
        else {
          iVar3 = bcmp((void *)signal_int.super_SignalBase._vptr_SignalBase,
                       (void *)signal_void.super_SignalBase._vptr_SignalBase,
                       (size_t)emitted_string._M_dataplus._M_p);
          bVar9 = iVar3 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (SVar1.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
        operator_delete((void *)SVar1.super_SignalBase._vptr_SignalBase);
      }
      if (!bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)signal_int.super_SignalBase._vptr_SignalBase,
                            (long)emitted_string._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)signal_void.super_SignalBase._vptr_SignalBase,
                            (long)local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (signal_void.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
          operator_delete((void *)signal_void.super_SignalBase._vptr_SignalBase);
        }
        signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
        SVar1.super_SignalBase._vptr_SignalBase = signal_void.super_SignalBase._vptr_SignalBase;
        if ((emitted_string._M_dataplus._M_p != local_70) ||
           ((emitted_string._M_dataplus._M_p != (pointer)0x0 &&
            (iVar3 = bcmp((void *)signal_int.super_SignalBase._vptr_SignalBase,
                          (void *)signal_void.super_SignalBase._vptr_SignalBase,
                          (size_t)emitted_string._M_dataplus._M_p), iVar3 != 0)))) {
          __assert_fail("(emitted_string) == (std::string(\"one\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x50,"void tst_signal_basic()");
        }
        if (SVar1.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
          operator_delete((void *)SVar1.super_SignalBase._vptr_SignalBase);
        }
      }
      if ((emitter.m_buckets._4_4_ != 2.0) || (NAN(emitter.m_buckets._4_4_))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::ostream::_M_insert<double>((double)emitter.m_buckets._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        poVar4 = std::ostream::_M_insert<double>(2.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((emitter.m_buckets._4_4_ != 2.0) || (NAN(emitter.m_buckets._4_4_))) {
          __assert_fail("(emitted_float1) == (2.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x51,"void tst_signal_basic()");
        }
      }
      if ((local_38 != 3.0) || (NAN(local_38))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::ostream::_M_insert<double>((double)local_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        poVar4 = std::ostream::_M_insert<double>(3.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((local_38 != 3.0) || (NAN(local_38))) {
          __assert_fail("(emitted_float2) == (3.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x52,"void tst_signal_basic()");
        }
      }
      signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
      SVar1.super_SignalBase._vptr_SignalBase = signal_void.super_SignalBase._vptr_SignalBase;
      if ((pointer)cfuncvalue_string_abi_cxx11_._M_string_length == local_70) {
        if (cfuncvalue_string_abi_cxx11_._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar3 = bcmp(cfuncvalue_string_abi_cxx11_._M_dataplus._M_p,
                       (void *)signal_void.super_SignalBase._vptr_SignalBase,
                       cfuncvalue_string_abi_cxx11_._M_string_length);
          bVar9 = iVar3 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (SVar1.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
        operator_delete((void *)SVar1.super_SignalBase._vptr_SignalBase);
      }
      if (!bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,cfuncvalue_string_abi_cxx11_._M_dataplus._M_p,
                            cfuncvalue_string_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)signal_void.super_SignalBase._vptr_SignalBase,
                            (long)local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (signal_void.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
          operator_delete((void *)signal_void.super_SignalBase._vptr_SignalBase);
        }
        signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)(SignalBase)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&signal_void,"one","");
        SVar1.super_SignalBase._vptr_SignalBase = signal_void.super_SignalBase._vptr_SignalBase;
        if (((pointer)cfuncvalue_string_abi_cxx11_._M_string_length != local_70) ||
           ((cfuncvalue_string_abi_cxx11_._M_string_length != 0 &&
            (iVar3 = bcmp(cfuncvalue_string_abi_cxx11_._M_dataplus._M_p,
                          (void *)signal_void.super_SignalBase._vptr_SignalBase,
                          cfuncvalue_string_abi_cxx11_._M_string_length), iVar3 != 0)))) {
          __assert_fail("(cfuncvalue_string) == (std::string(\"one\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x53,"void tst_signal_basic()");
        }
        if (SVar1.super_SignalBase._vptr_SignalBase != (SignalBase)local_68) {
          operator_delete((void *)SVar1.super_SignalBase._vptr_SignalBase);
        }
      }
      if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::ostream::_M_insert<double>((double)cfuncvalue_float1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        poVar4 = std::ostream::_M_insert<double>(2.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
          __assert_fail("(cfuncvalue_float1) == (2.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x54,"void tst_signal_basic()");
        }
      }
      if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb)
        ;
        poVar4 = std::ostream::_M_insert<double>((double)cfuncvalue_float2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' vs \'",6);
        poVar4 = std::ostream::_M_insert<double>(3.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
          __assert_fail("(cfuncvalue_float2) == (3.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                        ,0x55,"void tst_signal_basic()");
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"void tst_signal_basic()",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      local_288 = &PTR__SignalHandler_Function_00115a98;
      if (stringFloatFloatCFunc.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)stringFloatFloatCFunc.m_handler.super__Function_base._M_functor._8_8_)
                  (&stringFloatFloatCFunc,&stringFloatFloatCFunc,3);
      }
      intCFunc.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115a98;
      if (stringFloatFloatLambda.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)stringFloatFloatLambda.m_handler.super__Function_base._M_functor._8_8_)
                  (&stringFloatFloatLambda,&stringFloatFloatLambda,3);
      }
      if (signal_int.super_SignalBase._vptr_SignalBase !=
          (SignalBase)&emitted_string._M_string_length) {
        operator_delete((void *)signal_int.super_SignalBase._vptr_SignalBase);
      }
      intLambda.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115ae8;
      if (intCFunc.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)intCFunc.m_handler.super__Function_base._M_functor._8_8_)(&intCFunc,&intCFunc,3);
      }
      stringFloatFloatCFunc.m_handler._M_invoker =
           (_Invoker_type)&PTR__SignalHandler_Function_00115ae8;
      if (intLambda.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)intLambda.m_handler.super__Function_base._M_functor._8_8_)
                  (&intLambda,&intLambda,3);
      }
      voidLambda.m_handler._M_invoker = (_Invoker_type)&PTR__SignalHandler_Function_00115b38;
      if (voidCFunc.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)voidCFunc.m_handler.super__Function_base._M_functor._8_8_)
                  (&voidCFunc,&voidCFunc,3);
      }
      local_128 = (undefined1  [8])&PTR__SignalHandler_Function_00115b38;
      if (voidLambda.m_handler.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)voidLambda.m_handler.super__Function_base._M_functor._8_8_)
                  (&voidLambda,&voidLambda,3);
      }
      _auStack_50 = &PTR__SignalEmitter_001159d8;
      rengine::Signal<>::emit(&rengine::SignalEmitter::onDestruction,(SignalEmitter *)auStack_50);
      pp_Var2 = emitter._vptr_SignalEmitter;
      if ((emitter._vptr_SignalEmitter != (_func_int **)0x0) &&
         (*emitter._vptr_SignalEmitter != (_func_int *)0x0)) {
        operator_delete(*emitter._vptr_SignalEmitter);
      }
      operator_delete(pp_Var2);
      return;
    }
    __assert_fail("called_string_float_float",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x4e,"void tst_signal_basic()");
  }
  __assert_fail("called_int",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                ,0x3b,"void tst_signal_basic()");
}

Assistant:

void tst_signal_basic()
{
    bool called_void = false;
    bool called_int = false;
    bool called_string_float_float = false;

    SignalEmitter emitter;

    SignalHandler_Function<> voidLambda([&]() { called_void = true; });
    SignalHandler_Function<> voidCFunc(cfunc_void);

    Signal<> signal_void;
    signal_void.connect(&emitter, &voidLambda);
    signal_void.connect(&emitter, &voidCFunc);
    signal_void.emit(&emitter);
    check_true(cfunc_void_called);
    check_true(called_void);
    signal_void.disconnect(&emitter, &voidCFunc);
    signal_void.disconnect(&emitter, &voidLambda);

    int emitted_int = 0;
    SignalHandler_Function<int> intLambda([&] (int value) {
        called_int = true;
        emitted_int = value;
    });
    SignalHandler_Function<int> intCFunc(cfunc_int);
    Signal<int> signal_int;
    signal_int.connect(&emitter, &intLambda);
    signal_int.connect(&emitter, &intCFunc);
    signal_int.emit(&emitter, 42);
    check_true(called_int);
    check_true(cfunc_int_called);
    check_equal(emitted_int, 42);
    check_equal(cfuncvalue_int, 42);

    std::string emitted_string;
    float emitted_float1 = 0;
    float emitted_float2 = 0;
    SignalHandler_Function<std::string, float, float> stringFloatFloatLambda([&](std::string str, float a, float b) {
        called_string_float_float = true;
        emitted_string = str;
        emitted_float1 = a;
        emitted_float2 = b;
    });
    SignalHandler_Function<std::string, float, float> stringFloatFloatCFunc(cfunc_string_float_float);
    Signal<std::string, float, float> signal_string_float_float;
    signal_string_float_float.connect(&emitter, &stringFloatFloatLambda);
    signal_string_float_float.connect(&emitter, &stringFloatFloatCFunc);
    signal_string_float_float.emit(&emitter, std::string("one"), 2.0f, 3.0f);
    check_true(called_string_float_float);
    check_true(cfunc_string_float_float_called);
    check_equal(emitted_string, std::string("one"));
    check_equal(emitted_float1, 2.0f);
    check_equal(emitted_float2, 3.0f);
    check_equal(cfuncvalue_string, std::string("one"));
    check_equal(cfuncvalue_float1, 2.0f);
    check_equal(cfuncvalue_float2, 3.0f);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}